

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_28::KotlinCodeGenerator::~KotlinCodeGenerator(KotlinCodeGenerator *this)

{
  KotlinCodeGenerator *this_local;
  
  ~KotlinCodeGenerator(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateKotlin(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }